

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_RecordCallback_Test::TestBody
          (SSLVersionTest_RecordCallback_Test *this)

{
  tuple<ssl_ctx_st_*,_bssl::internal::Deleter> ctx;
  internal iVar1;
  char cVar2;
  bool bVar3;
  ParamType *pPVar4;
  char *expected_predicate_value;
  long lVar5;
  ScopedTrace gtest_trace_4631;
  bool write_seen;
  bool read_seen;
  bool test_server;
  AssertionResult gtest_ar_;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  CallbackType cb;
  ScopedTrace local_dc;
  internal local_db;
  internal local_da;
  bool local_d9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  internal local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  byte local_ba [2];
  undefined1 local_b8 [24];
  size_type sStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  AssertHelper local_60;
  AssertHelper local_58;
  internal *local_50;
  SSLVersionTest_RecordCallback_Test *local_48;
  UniquePtr<SSL> *local_40;
  UniquePtr<SSL> *local_38;
  
  pPVar4 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar4->version != 0xfefc) {
    local_ba[0] = 1;
    local_ba[1] = 0;
    local_38 = &(this->super_SSLVersionTest).client_;
    local_40 = &(this->super_SSLVersionTest).server_;
    lVar5 = 0;
    while( true ) {
      local_d9 = (bool)local_ba[lVar5];
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_dc,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1217,&local_d9);
      bVar3 = testing::internal::AlwaysTrue();
      if (!bVar3) break;
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_b8);
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
      }
      cVar2 = local_b8[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_b8);
      if (cVar2 != '\0') break;
      local_da = (internal)0x0;
      local_db = (internal)0x0;
      local_58.data_ = (AssertHelperData *)&local_db;
      local_50 = &local_da;
      ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (&(this->super_SSLVersionTest).server_ctx_)[local_d9 ^ 1]._M_t.
           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>;
      local_48 = this;
      SSL_CTX_set_msg_callback
                ((SSL_CTX *)
                 ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                 TestBody::anon_class_1_0_00000001::__invoke);
      SSL_CTX_set_msg_callback_arg
                ((SSL_CTX *)
                 ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_58);
      local_98._8_8_ = 0;
      local_78._8_8_ = 0;
      local_b8._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      local_b8._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
      local_b8._16_8_ = &local_98;
      sStack_a0 = 0;
      local_98._M_allocated_capacity = 0;
      sStack_80 = 0;
      local_78._M_allocated_capacity = 0;
      local_68._0_4_ = 0;
      local_68._4_1_ = false;
      local_68._5_3_ = 0;
      bVar3 = (this->super_SSLVersionTest).shed_handshake_config_;
      expected_predicate_value = (char *)(ulong)bVar3;
      local_88._M_p = (pointer)&local_78;
      local_d0[0] = (internal)
                    ConnectClientAndServer
                              (local_38,local_40,
                               (this->super_SSLVersionTest).client_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (this->super_SSLVersionTest).server_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (ClientConfig *)local_b8,bVar3);
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._16_8_ != &local_98) {
        operator_delete((void *)local_b8._16_8_,local_98._M_allocated_capacity + 1);
      }
      iVar1 = local_d0[0];
      if (local_d0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,local_d0,(AssertionResult *)"Connect()","false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1247,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_d8);
LAB_00191f59:
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b8._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
        }
        if (local_d8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_d8._M_head_impl + 8))();
        }
      }
      else {
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c8,local_c8);
        }
        local_d0[0] = local_da;
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_da == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_b8,local_d0,(AssertionResult *)"read_seen","false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1249,(char *)local_b8._0_8_);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if ((SSL_SESSION *)local_b8._0_8_ != (SSL_SESSION *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          if (local_d8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_d8._M_head_impl + 8))();
          }
        }
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c8,local_c8);
        }
        local_d0[0] = local_db;
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_db == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_b8,local_d0,(AssertionResult *)"write_seen","false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x124a,(char *)local_b8._0_8_);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_d8);
          goto LAB_00191f59;
        }
      }
      if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,local_c8);
      }
      testing::ScopedTrace::~ScopedTrace(&local_dc);
      if (iVar1 == (internal)0x0) {
        return;
      }
      bVar3 = lVar5 == 1;
      lVar5 = lVar5 + 1;
      if (bVar3) {
        return;
      }
    }
    testing::Message::Message((Message *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1218,
               "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
    testing::ScopedTrace::~ScopedTrace(&local_dc);
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, RecordCallback) {
  if (version() == DTLS1_3_VERSION) {
    // The DTLS 1.3 record header is vastly different than the TLS or DTLS < 1.3
    // header format. Instead of checking that the record header is formatted as
    // expected here, the runner implementation in dtls.go is strict about what
    // it accepts.
    return;
  }
  for (bool test_server : {true, false}) {
    SCOPED_TRACE(test_server);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());

    bool read_seen = false;
    bool write_seen = false;
    auto cb = [&](int is_write, int cb_version, int cb_type, const void *buf,
                  size_t len, SSL *ssl) {
      if (cb_type != SSL3_RT_HEADER) {
        return;
      }

      // The callback does not report a version for records.
      EXPECT_EQ(0, cb_version);

      if (is_write) {
        write_seen = true;
      } else {
        read_seen = true;
      }

      // Sanity-check that the record header is plausible.
      CBS cbs;
      CBS_init(&cbs, reinterpret_cast<const uint8_t *>(buf), len);
      uint8_t type;
      uint16_t record_version, length;
      ASSERT_TRUE(CBS_get_u8(&cbs, &type));
      ASSERT_TRUE(CBS_get_u16(&cbs, &record_version));
      EXPECT_EQ(record_version >> 8, is_dtls() ? 0xfe : 0x03);
      if (is_dtls()) {
        uint16_t epoch;
        ASSERT_TRUE(CBS_get_u16(&cbs, &epoch));
        uint16_t max_epoch = 1;
        EXPECT_LE(epoch, max_epoch) << "Invalid epoch: " << epoch;
        ASSERT_TRUE(CBS_skip(&cbs, 6));
      }
      ASSERT_TRUE(CBS_get_u16(&cbs, &length));
      EXPECT_EQ(0u, CBS_len(&cbs));
    };
    using CallbackType = decltype(cb);
    SSL_CTX *ctx = test_server ? server_ctx_.get() : client_ctx_.get();
    SSL_CTX_set_msg_callback(
        ctx, [](int is_write, int cb_version, int cb_type, const void *buf,
                size_t len, SSL *ssl, void *arg) {
          CallbackType *cb_ptr = reinterpret_cast<CallbackType *>(arg);
          (*cb_ptr)(is_write, cb_version, cb_type, buf, len, ssl);
        });
    SSL_CTX_set_msg_callback_arg(ctx, &cb);

    ASSERT_TRUE(Connect());

    EXPECT_TRUE(read_seen);
    EXPECT_TRUE(write_seen);
  }
}